

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void update_data_from_objs(Am_Value *objs_value,Am_Value *new_data_value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  Am_Object local_98;
  Am_Inter_Location local_90;
  Am_Inter_Location new_data;
  Am_Object local_80;
  Am_Inter_Location local_78;
  Am_Object local_70;
  undefined1 local_68 [8];
  Am_Value_List new_data_list;
  Am_Value_List objs_list;
  int h;
  int w;
  int top;
  int left;
  Am_Object local_28;
  Am_Object owner;
  Am_Object obj;
  Am_Value *new_data_value_local;
  Am_Value *objs_value_local;
  
  Am_Object::Am_Object(&owner);
  Am_Object::Am_Object(&local_28);
  bVar1 = Am_Value_List::Test(objs_value);
  if (bVar1) {
    Am_Value_List::Am_Value_List((Am_Value_List *)&new_data_list.item);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_68);
    Am_Value_List::operator=((Am_Value_List *)&new_data_list.item,objs_value);
    Am_Value_List::Start((Am_Value_List *)&new_data_list.item);
    while( true ) {
      bVar1 = Am_Value_List::Last((Am_Value_List *)&new_data_list.item);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pAVar6 = Am_Value_List::Get((Am_Value_List *)&new_data_list.item);
      Am_Object::operator=(&owner,pAVar6);
      Am_Object::Get_Owner(&local_70,(Am_Slot_Flags)&owner);
      Am_Object::operator=(&local_28,&local_70);
      Am_Object::~Am_Object(&local_70);
      pAVar6 = Am_Object::Get(&owner,100,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(&owner,0x65,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(&owner,0x66,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar6);
      pAVar6 = Am_Object::Get(&owner,0x67,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar6);
      Am_Object::Am_Object(&local_80,&local_28);
      Am_Inter_Location::Am_Inter_Location
                (&local_78,false,&local_80,iVar2,iVar3,iVar4,iVar5,true,true);
      pAVar7 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&local_78);
      Am_Value_List::Add((Am_Value_List *)local_68,pAVar7,Am_TAIL,true);
      Am_Inter_Location::~Am_Inter_Location(&local_78);
      Am_Object::~Am_Object(&local_80);
      Am_Value_List::Next((Am_Value_List *)&new_data_list.item);
    }
    pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_68);
    Am_Value::operator=(new_data_value,pAVar7);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_68);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&new_data_list.item);
  }
  else {
    bVar1 = Am_Object::Test(objs_value);
    if (!bVar1) {
      Am_Error("objs not a list or object");
    }
    Am_Object::operator=(&owner,objs_value);
    Am_Object::Get_Owner((Am_Object *)&new_data,(Am_Slot_Flags)&owner);
    Am_Object::operator=(&local_28,(Am_Object *)&new_data);
    Am_Object::~Am_Object((Am_Object *)&new_data);
    pAVar6 = Am_Object::Get(&owner,100,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&owner,0x65,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&owner,0x66,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = Am_Object::Get(&owner,0x67,0);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    Am_Object::Am_Object(&local_98,&local_28);
    Am_Inter_Location::Am_Inter_Location
              (&local_90,false,&local_98,iVar2,iVar3,iVar4,iVar5,true,true);
    Am_Object::~Am_Object(&local_98);
    pAVar7 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&local_90);
    Am_Value::operator=(new_data_value,pAVar7);
    Am_Inter_Location::~Am_Inter_Location(&local_90);
  }
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&owner);
  return;
}

Assistant:

void
update_data_from_objs(Am_Value objs_value, Am_Value &new_data_value)
{
  Am_Object obj, owner;
  int left, top, w, h;
  if (Am_Value_List::Test(objs_value)) {
    Am_Value_List objs_list, new_data_list;
    objs_list = objs_value;
    for (objs_list.Start(); !objs_list.Last(); objs_list.Next()) {
      obj = objs_list.Get();
      owner = obj.Get_Owner();
      left = obj.Get(Am_LEFT);
      top = obj.Get(Am_TOP);
      w = obj.Get(Am_WIDTH);
      h = obj.Get(Am_HEIGHT);
      new_data_list.Add(Am_Inter_Location(false, owner, left, top, w, h));
    }
    new_data_value = new_data_list;
  } else if (Am_Object::Test(objs_value)) {
    obj = objs_value;
    owner = obj.Get_Owner();
    left = obj.Get(Am_LEFT);
    top = obj.Get(Am_TOP);
    w = obj.Get(Am_WIDTH);
    h = obj.Get(Am_HEIGHT);
    Am_Inter_Location new_data(false, owner, left, top, w, h);
    new_data_value = new_data;
  } else
    Am_Error("objs not a list or object");
}